

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  result rVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  long *plVar5;
  uint64_t error;
  ulong uVar6;
  int exp;
  size_t __len;
  ulong uVar7;
  grisu_shortest_handler handler;
  int iStack_4c;
  grisu_shortest_handler local_48;
  
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                ,0x42e,"value is negative");
  }
  if (value <= (longdouble)0) {
    if (precision < 1 || ((ulong)specs & 0xff00000000) != 0x200000000) {
      sVar2 = buf->size_;
      uVar6 = sVar2 + 1;
      if (buf->capacity_ < uVar6) {
        (**buf->_vptr_buffer)(buf);
        sVar2 = buf->size_;
        uVar6 = sVar2 + 1;
      }
      buf->size_ = uVar6;
      buf->ptr_[sVar2] = '0';
      iStack_4c = 0;
    }
    else {
      uVar7 = (ulong)(uint)precision;
      uVar6 = buf->capacity_;
      if (uVar6 < uVar7) {
        (**buf->_vptr_buffer)(buf,uVar7);
        uVar6 = buf->capacity_;
      }
      if (uVar7 <= uVar6) {
        uVar6 = uVar7;
      }
      buf->size_ = uVar6;
      memset(buf->ptr_,0x30,uVar7);
      iStack_4c = -precision;
    }
  }
  else if (((ulong)specs >> 0x33 & 1) == 0) {
    iStack_4c = snprintf_float<long_double>(value,precision,specs,buf);
  }
  else if (precision < 0) {
    uVar7 = 0x26604b7a84467;
    local_48.buf = buf->ptr_;
    local_48.size = 0;
    local_48.diff = 0x465e6604b7a84467;
    uVar6 = 0x1197;
    uVar4 = 5;
    plVar5 = (long *)&DAT_00121518;
    do {
      exp = uVar4 - 2;
      uVar3 = uVar6 / 1000;
      uVar6 = (ulong)(uint)((int)uVar6 + (int)(uVar6 / 1000) * -1000);
      rVar1 = grisu_shortest_handler::on_digit
                        (&local_48,(char)uVar3 + '0',*plVar5 << 0x32,uVar6 << 0x32 | 0x26604b7a84467
                         ,2,exp,true);
      if (rVar1 != more) goto LAB_001134b7;
      uVar4 = uVar4 - 1;
      plVar5 = plVar5 + -1;
    } while (1 < uVar4);
    error = 2;
    exp = 0;
    do {
      uVar6 = uVar7 * 10;
      error = error * 10;
      uVar7 = uVar6 & 0x3fffffffffffe;
      exp = exp + -1;
      rVar1 = grisu_shortest_handler::on_digit
                        (&local_48,(byte)(uVar6 >> 0x32) | 0x30,0x4000000000000,uVar7,error,exp,
                         false);
    } while (rVar1 == more);
LAB_001134b7:
    uVar6 = (ulong)(uint)local_48.size;
    if (rVar1 == error) {
      iStack_4c = local_48.size + exp + 0xb;
      fallback_format<long_double>(value,buf,&iStack_4c);
    }
    else {
      if (local_48.size < 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/core.h"
                    ,0x13d,"negative value");
      }
      uVar7 = buf->capacity_;
      if (uVar7 < uVar6) {
        (**buf->_vptr_buffer)(buf,uVar6);
        uVar7 = buf->capacity_;
      }
      if (uVar7 < uVar6) {
        uVar6 = uVar7;
      }
      buf->size_ = uVar6;
      iStack_4c = exp + 0xc;
    }
  }
  else {
    if ((uint)precision < 0x12) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                  ,0x32d,"");
    }
    iStack_4c = snprintf_float<long_double>(value,precision,specs,buf);
  }
  return iStack_4c;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.try_resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed && !specs.showpoint) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.try_resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}